

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrespondent.c
# Opt level: O3

int nn_xrespondent_add(nn_sockbase *self,nn_pipe *pipe)

{
  undefined8 *data;
  int rcvprio;
  size_t sz;
  int local_2c;
  size_t local_28;
  
  local_28 = 4;
  nn_pipe_getopt(pipe,0,9,&local_2c,&local_28);
  if (local_28 == 4) {
    if (0xffffffef < local_2c - 0x11U) {
      data = (undefined8 *)nn_alloc_(0x48);
      if (data != (undefined8 *)0x0) {
        *data = pipe;
        nn_hash_item_init((nn_hash_item *)(data + 1));
        *(undefined4 *)(data + 8) = 0;
        nn_hash_insert((nn_hash *)&self[1].sock,*(uint *)&self[1].vfptr & 0x7fffffff,
                       (nn_hash_item *)(data + 1));
        *(int *)&self[1].vfptr = *(int *)&self[1].vfptr + 1;
        nn_fq_add((nn_fq *)&self[2].sock,(nn_fq_data *)(data + 4),pipe,local_2c);
        nn_pipe_setdata(pipe,data);
        return 0;
      }
      goto LAB_00153335;
    }
  }
  else {
    nn_xrespondent_add_cold_1();
  }
  nn_xrespondent_add_cold_3();
LAB_00153335:
  nn_xrespondent_add_cold_2();
}

Assistant:

int nn_xrespondent_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xrespondent *xrespondent;
    struct nn_xrespondent_data *data;
    int rcvprio;
    size_t sz;

    xrespondent = nn_cont (self, struct nn_xrespondent, sockbase);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (*data), "pipe data (xrespondent)");
    alloc_assert (data);

    data->pipe = pipe;
    nn_hash_item_init (&data->outitem);
    data->flags = 0;
    nn_hash_insert (&xrespondent->outpipes, xrespondent->next_key & 0x7fffffff,
        &data->outitem);
    xrespondent->next_key++;
    nn_fq_add (&xrespondent->inpipes, &data->initem, pipe, rcvprio);
    nn_pipe_setdata (pipe, data);

    return 0;
}